

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O2

void __thiscall xray_re::cse_abstract::~cse_abstract(cse_abstract *this)

{
  this->_vptr_cse_abstract = (_func_int **)&PTR__cse_abstract_002359b0;
  std::
  _Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>::
  ~_Deque_base((_Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
                *)&this->m_markers);
  std::__cxx11::string::~string((string *)&this->m_ini_string);
  std::__cxx11::string::~string((string *)&this->m_s_name);
  std::__cxx11::string::~string((string *)&this->m_s_name_replace);
  return;
}

Assistant:

cse_abstract::~cse_abstract() {}